

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode Curl_hsts_parse(hsts *h,char *hostname,char *header)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  char *local_60;
  char *endp;
  CURLofft offt;
  _Bool quoted;
  time_t now;
  stsentry *sts;
  _Bool subdomains;
  _Bool gotinc;
  long lStack_38;
  _Bool gotma;
  curl_off_t expires;
  char *p;
  char *header_local;
  char *hostname_local;
  hsts *h_local;
  
  lStack_38 = 0;
  sts._7_1_ = 0;
  sts._6_1_ = 0;
  sts._5_1_ = 0;
  expires = (curl_off_t)header;
  p = header;
  header_local = hostname;
  hostname_local = (char *)h;
  _offt = time((time_t *)0x0);
  _Var1 = Curl_host_is_ipnum(header_local);
  if (_Var1) {
    h_local._4_4_ = CURLE_OK;
  }
  else {
    do {
      while( true ) {
        bVar3 = false;
        if (*(char *)expires != '\0') {
          iVar2 = Curl_isspace((uint)*(byte *)expires);
          bVar3 = iVar2 != 0;
        }
        if (!bVar3) break;
        expires = expires + 1;
      }
      iVar2 = Curl_strncasecompare("max-age=",(char *)expires,8);
      if (iVar2 == 0) {
        iVar2 = Curl_strncasecompare("includesubdomains",(char *)expires,0x11);
        if (iVar2 == 0) {
          while( true ) {
            bVar3 = false;
            if (*(char *)expires != '\0') {
              bVar3 = *(char *)expires != ';';
            }
            if (!bVar3) break;
            expires = expires + 1;
          }
        }
        else {
          if ((sts._6_1_ & 1) != 0) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          sts._5_1_ = 1;
          expires = expires + 0x11;
          sts._6_1_ = 1;
        }
      }
      else {
        endp._7_1_ = 0;
        if ((sts._7_1_ & 1) != 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        expires = expires + 8;
        while( true ) {
          bVar3 = false;
          if (*(char *)expires != '\0') {
            iVar2 = Curl_isspace((uint)*(byte *)expires);
            bVar3 = iVar2 != 0;
          }
          if (!bVar3) break;
          expires = expires + 1;
        }
        if (*(char *)expires == '\"') {
          expires = expires + 1;
          endp._7_1_ = 1;
        }
        endp._0_4_ = curlx_strtoofft((char *)expires,&local_60,10,&stack0xffffffffffffffc8);
        if ((CURLofft)endp == CURL_OFFT_FLOW) {
          lStack_38 = 0x7fffffffffffffff;
        }
        else if ((CURLofft)endp != CURL_OFFT_OK) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        expires = (curl_off_t)local_60;
        if ((endp._7_1_ & 1) != 0) {
          if (*local_60 != '\"') {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          expires = (curl_off_t)(local_60 + 1);
        }
        sts._7_1_ = 1;
      }
      while( true ) {
        bVar3 = false;
        if (*(char *)expires != '\0') {
          iVar2 = Curl_isspace((uint)*(byte *)expires);
          bVar3 = iVar2 != 0;
        }
        if (!bVar3) break;
        expires = expires + 1;
      }
      if (*(char *)expires == ';') {
        expires = expires + 1;
      }
    } while (*(char *)expires != '\0');
    if ((sts._7_1_ & 1) == 0) {
      h_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else if (lStack_38 == 0) {
      now = (time_t)Curl_hsts((hsts *)hostname_local,header_local,false);
      if ((stsentry *)now != (stsentry *)0x0) {
        Curl_llist_remove((Curl_llist *)hostname_local,(Curl_llist_element *)now,(void *)0x0);
        hsts_free((stsentry *)now);
      }
      h_local._4_4_ = CURLE_OK;
    }
    else {
      if (0x7fffffffffffffff - _offt < lStack_38) {
        lStack_38 = 0x7fffffffffffffff;
      }
      else {
        lStack_38 = _offt + lStack_38;
      }
      now = (time_t)Curl_hsts((hsts *)hostname_local,header_local,false);
      if ((stsentry *)now == (stsentry *)0x0) {
        h_local._4_4_ =
             hsts_create((hsts *)hostname_local,header_local,(_Bool)(sts._5_1_ & 1),lStack_38);
      }
      else {
        ((stsentry *)now)->expires = lStack_38;
        ((stsentry *)now)->includeSubDomains = (_Bool)(sts._5_1_ & 1);
        h_local._4_4_ = CURLE_OK;
      }
    }
  }
  return h_local._4_4_;
}

Assistant:

CURLcode Curl_hsts_parse(struct hsts *h, const char *hostname,
                         const char *header)
{
  const char *p = header;
  curl_off_t expires = 0;
  bool gotma = FALSE;
  bool gotinc = FALSE;
  bool subdomains = FALSE;
  struct stsentry *sts;
  time_t now = time(NULL);

  if(Curl_host_is_ipnum(hostname))
    /* "explicit IP address identification of all forms is excluded."
       / RFC 6797 */
    return CURLE_OK;

  do {
    while(*p && ISSPACE(*p))
      p++;
    if(Curl_strncasecompare("max-age=", p, 8)) {
      bool quoted = FALSE;
      CURLofft offt;
      char *endp;

      if(gotma)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      p += 8;
      while(*p && ISSPACE(*p))
        p++;
      if(*p == '\"') {
        p++;
        quoted = TRUE;
      }
      offt = curlx_strtoofft(p, &endp, 10, &expires);
      if(offt == CURL_OFFT_FLOW)
        expires = CURL_OFF_T_MAX;
      else if(offt)
        /* invalid max-age */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      p = endp;
      if(quoted) {
        if(*p != '\"')
          return CURLE_BAD_FUNCTION_ARGUMENT;
        p++;
      }
      gotma = TRUE;
    }
    else if(Curl_strncasecompare("includesubdomains", p, 17)) {
      if(gotinc)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      subdomains = TRUE;
      p += 17;
      gotinc = TRUE;
    }
    else {
      /* unknown directive, do a lame attempt to skip */
      while(*p && (*p != ';'))
        p++;
    }

    while(*p && ISSPACE(*p))
      p++;
    if(*p == ';')
      p++;
  } while (*p);

  if(!gotma)
    /* max-age is mandatory */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!expires) {
    /* remove the entry if present verbatim (without subdomain match) */
    sts = Curl_hsts(h, hostname, FALSE);
    if(sts) {
      Curl_llist_remove(&h->list, &sts->node, NULL);
      hsts_free(sts);
    }
    return CURLE_OK;
  }

  if(CURL_OFF_T_MAX - now < expires)
    /* would overflow, use maximum value */
    expires = CURL_OFF_T_MAX;
  else
    expires += now;

  /* check if it already exists */
  sts = Curl_hsts(h, hostname, FALSE);
  if(sts) {
    /* just update these fields */
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
  }
  else
    return hsts_create(h, hostname, subdomains, expires);

  return CURLE_OK;
}